

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

int __thiscall
Fl_PostScript_Graphics_Driver::clip_box
          (Fl_PostScript_Graphics_Driver *this,int x,int y,int w,int h,int *X,int *Y,int *W,int *H)

{
  int iVar1;
  uint local_34;
  int ret;
  int *X_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  if (this->clip_ == (Clip *)0x0) {
    *X = x;
    *Y = y;
    *W = w;
    *H = h;
    this_local._4_4_ = 1;
  }
  else if (this->clip_->w < 0) {
    *X = x;
    *Y = y;
    *W = w;
    *H = h;
    this_local._4_4_ = 1;
  }
  else {
    iVar1 = this->clip_->x;
    *X = iVar1;
    if (iVar1 < x) {
      *X = x;
    }
    local_34 = (uint)(iVar1 < x);
    iVar1 = this->clip_->y;
    *Y = iVar1;
    if (iVar1 < y) {
      *Y = y;
      local_34 = 1;
    }
    if (x + w < this->clip_->x + this->clip_->w) {
      *W = (x + w) - *X;
      local_34 = 1;
    }
    else {
      *W = (this->clip_->x + this->clip_->w) - *X;
    }
    if (*W < 0) {
      *W = 0;
      this_local._4_4_ = 1;
    }
    else {
      if (y + h < this->clip_->y + this->clip_->h) {
        *H = (y + h) - *Y;
        local_34 = 1;
      }
      else {
        *H = (this->clip_->y + this->clip_->h) - *Y;
      }
      if (*H < 0) {
        *W = 0;
        *H = 0;
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ = local_34;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_PostScript_Graphics_Driver::clip_box(int x, int y, int w, int h, int &X, int &Y, int &W, int &H){
  if(!clip_){
    X=x;Y=y;W=w;H=h;
    return 1;
  }
  if(clip_->w < 0){
    X=x;Y=y;W=w;H=h;
    return 1;
  }
  int ret=0;
  if (x > (X=clip_->x)) {X=x; ret=1;}
  if (y > (Y=clip_->y)) {Y=y; ret=1;}
  if ((x+w) < (clip_->x+clip_->w)) {
    W=x+w-X;
    
    ret=1;
    
  }else
    W = clip_->x + clip_->w - X;
  if(W<0){
    W=0;
    return 1;
  }
  if ((y+h) < (clip_->y+clip_->h)) {
    H=y+h-Y;
    ret=1;
  }else
    H = clip_->y + clip_->h - Y;
  if(H<0){
    W=0;
    H=0;
    return 1;
  }
  return ret;
}